

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O2

List<Variant> * __thiscall Variant::toList(Variant *this)

{
  int iVar1;
  List<Variant> *pLVar2;
  
  if (this->data->type == listType) {
    pLVar2 = (List<Variant> *)(this->data + 1);
  }
  else {
    pLVar2 = &toList::list;
    if (toList()::list == '\0') {
      iVar1 = __cxa_guard_acquire(&toList()::list);
      if (iVar1 != 0) {
        toList::list._end.item = &toList::list.endItem;
        pLVar2 = &toList::list;
        toList::list._begin.item = &toList::list.endItem;
        toList::list._size = 0;
        toList::list.endItem.value.data = &nullData.super_Data;
        toList::list.endItem.prev = (Item *)0x0;
        toList::list.endItem.next = (Item *)0x0;
        toList::list.freeItem = (Item *)0x0;
        toList::list.blocks = (ItemBlock *)0x0;
        __cxa_atexit(List<Variant>::~List,&toList::list,&__dso_handle);
        __cxa_guard_release(&toList()::list);
      }
    }
  }
  return pLVar2;
}

Assistant:

const List<Variant>& toList() const
  {
    if(data->type == listType)
      return *(const List<Variant>*)(data + 1);
    static const List<Variant> list;
    return list;
  }